

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool system_set(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  _Bool _Var1;
  gravity_fiber_t *fiber;
  gravity_value_t value;
  char _buffer [4096];
  char local_1028 [4104];
  
  _Var1 = true;
  if (args[1].isa == gravity_class_string) {
    _Var1 = gravity_vm_set(vm,(char *)(args[1].field_1.p)->objclass,args[2]);
    if (!_Var1) {
      builtin_strncpy(local_1028 + 0x10,"System setting.",0x10);
      builtin_strncpy(local_1028,"Unable to apply ",0x10);
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1028);
      value.field_1.n = 0;
      value.isa = gravity_class_null;
      gravity_vm_setslot(vm,value,rindex);
    }
  }
  return _Var1;
}

Assistant:

static bool system_set (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused (nargs, rindex)
    gravity_value_t key = GET_VALUE(1);
    gravity_value_t value = GET_VALUE(2);
    if (!VALUE_ISA_STRING(key)) RETURN_NOVALUE();

    bool result = gravity_vm_set(vm, VALUE_AS_CSTRING(key), value);
    if (!result) RETURN_ERROR("Unable to apply System setting.");
    RETURN_NOVALUE();
}